

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

ssize_t __thiscall
GGSock::Communicator::send(Communicator *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  Data *pDVar2;
  undefined8 extraout_RAX;
  TBufferSize size;
  string msg;
  lock_guard<std::mutex> lock;
  Data *data;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  Data *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_1;
  
  pDVar2 = getData((Communicator *)0x12d7c7);
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff80,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if ((pDVar2->isConnected & 1U) == 0) {
    local_1 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffa0);
    anon_unknown.dwarf_7001::MessageHeader::getSizeInBytes();
    std::__cxx11::string::reserve((ulong)&stack0xffffffffffffffa0);
    std::__cxx11::string::append<char_const*,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::append<char_const*,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::append<char_const*,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    bVar1 = Data::addMessageToSend(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) {
      local_1 = 0;
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    if (bVar1) {
      local_1 = 1;
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12d916);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffffffffffff01;
}

Assistant:

bool Communicator::send(TMessageType type, const char * dataBuffer, TBufferSize dataSize) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutexSend);

        if (data.isConnected == false) return false;

        {
            std::string msg;
            TBufferSize size = ::MessageHeader::getSizeInBytes() + dataSize;

            msg.reserve(size);

            msg.append(reinterpret_cast<const char*>(&size), reinterpret_cast<const char*>(&size)+sizeof(size));
            msg.append(reinterpret_cast<const char*>(&type), reinterpret_cast<const char*>(&type)+sizeof(type));
            msg.append(dataBuffer, dataBuffer + dataSize);

            if (data.addMessageToSend(std::move(msg)) == false) {
                // error, send buffer is full
                return false;
            }
        }

        return true;
    }